

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

double incircleslow(double *pa,double *pb,double *pc,double *pd)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double b;
  double dVar14;
  double dVar15;
  double b_00;
  double dVar16;
  double dVar17;
  double b_01;
  double dVar18;
  double b_02;
  double b_03;
  double b_04;
  double b_05;
  double dVar19;
  double b_06;
  double dVar20;
  double dVar21;
  double dVar22;
  double b_07;
  double dVar23;
  double dVar24;
  double dVar25;
  double b_08;
  double dVar26;
  double b_09;
  double dVar27;
  double b_10;
  double dVar28;
  double temp16 [16];
  double detyyt [64];
  double detyt [32];
  double detxxt [64];
  double detxt [32];
  double detyy [64];
  double dety [32];
  double detxx [64];
  double detx [32];
  double detytyt [64];
  double detxtxt [64];
  double x2 [192];
  double y1 [128];
  double x1 [128];
  double y2 [192];
  double bdet [384];
  double adet [384];
  double cdet [384];
  double deter [1152];
  double abdet [768];
  double dStack_8650;
  double local_8638;
  double local_8630;
  double dStack_8628;
  double local_8620;
  double dStack_8618;
  double local_8610;
  double dStack_8608;
  double local_8600;
  double local_85f8;
  double local_85f0;
  double dStack_85e8;
  double local_85e0;
  double dStack_85d8;
  double local_85d0;
  double dStack_85c8;
  double local_85c0;
  double local_85b8;
  double local_85b0;
  double dStack_85a8;
  double local_85a0;
  double dStack_8598;
  double local_8590;
  double dStack_8588;
  double local_8580;
  double local_8578;
  double local_8570;
  double dStack_8568;
  double local_8560;
  double dStack_8558;
  double local_8550;
  double dStack_8548;
  double local_8540;
  double local_8538 [16];
  double local_84b8 [64];
  double local_82b8 [32];
  double local_81b8 [64];
  double local_7fb8 [32];
  double local_7eb8;
  double local_7eb0;
  double dStack_7ea8;
  double local_7ea0;
  double dStack_7e98;
  double local_7e90;
  double dStack_7e88;
  double local_7e80;
  double local_7e78;
  double local_7e70;
  double dStack_7e68;
  double local_7e60;
  double dStack_7e58;
  double local_7e50;
  double dStack_7e48;
  double local_7e40;
  double local_7e38 [64];
  double local_7c38 [32];
  double local_7b38 [64];
  double local_7938 [32];
  double local_7838 [64];
  double local_7638 [64];
  double local_7438 [192];
  double local_6e38 [128];
  double local_6a38 [128];
  double local_6638 [192];
  double local_6038 [384];
  double local_5438 [384];
  double local_4838 [383];
  double adStack_3c40 [1153];
  double local_1838 [769];
  
  dVar12 = *pa;
  dVar17 = *pb;
  dVar9 = pb[1];
  dVar10 = pc[1];
  dVar11 = *pd;
  dVar13 = pd[1];
  b_02 = dVar12 - dVar11;
  b_06 = (dVar12 - (b_02 + (dVar12 - b_02))) + ((dVar12 - b_02) - dVar11);
  b_10 = dVar17 - dVar11;
  b_09 = (dVar17 - (b_10 + (dVar17 - b_10))) + ((dVar17 - b_10) - dVar11);
  b_08 = dVar9 - dVar13;
  b_03 = (dVar9 - (b_08 + (dVar9 - b_08))) + ((dVar9 - b_08) - dVar13);
  dVar12 = pa[1];
  dVar17 = *pc;
  b_00 = dVar12 - dVar13;
  b_01 = dVar17 - dVar11;
  b_04 = (dVar12 - (b_00 + (dVar12 - b_00))) + ((dVar12 - b_00) - dVar13);
  b_05 = (dVar17 - (b_01 + (dVar17 - b_01))) + ((dVar17 - b_01) - dVar11);
  b = dVar10 - dVar13;
  b_07 = (dVar10 - (b + (dVar10 - b))) + ((dVar10 - b) - dVar13);
  dVar9 = b_06 * splitter - (b_06 * splitter - b_06);
  dVar10 = b_02 * splitter - (b_02 * splitter - b_02);
  dVar14 = splitter * b_03 - (splitter * b_03 - b_03);
  dVar15 = splitter * b_08 - (splitter * b_08 - b_08);
  dVar11 = b_06 * b_03;
  dVar13 = b_06 * b_08;
  dVar20 = b_06 - dVar9;
  dVar16 = b_03 - dVar14;
  dVar18 = b_08 - dVar15;
  local_8578 = dVar20 * dVar16 - (((dVar11 - dVar9 * dVar14) - dVar20 * dVar14) - dVar9 * dVar16);
  dVar25 = b_02 - dVar10;
  auVar1._8_4_ = SUB84(b_02,0);
  auVar1._0_8_ = b_02;
  auVar1._12_4_ = (int)((ulong)b_02 >> 0x20);
  dVar12 = b_02 * b_03;
  dVar17 = b_02 * b_08;
  dVar23 = dVar25 * dVar16 - (((dVar12 - dVar10 * dVar14) - dVar25 * dVar14) - dVar10 * dVar16);
  dVar24 = dVar25 * dVar18 - (((dVar17 - dVar10 * dVar15) - dVar25 * dVar15) - dVar10 * dVar18);
  dVar16 = dVar11 + dVar23;
  dVar19 = dVar13 + dVar24;
  dVar21 = dVar12 + dVar16;
  dVar22 = dVar16 - (dVar21 - dVar12);
  dVar14 = dVar18 * dVar20 - (((dVar13 - dVar9 * dVar15) - dVar15 * dVar20) - dVar9 * dVar18);
  dVar12 = (dVar11 - (dVar16 - (dVar16 - dVar11))) + (dVar23 - (dVar16 - dVar11));
  dVar11 = (dVar13 - (dVar19 - (dVar19 - dVar13))) + (dVar24 - (dVar19 - dVar13));
  dVar18 = dVar14 + dVar12;
  dVar16 = dVar22 + dVar18;
  dVar15 = (dVar22 - (dVar16 - (dVar16 - dVar22))) + (dVar18 - (dVar16 - dVar22));
  dVar13 = dVar21 + dVar16;
  dVar16 = (dVar21 - (dVar13 - (dVar13 - dVar21))) + (dVar16 - (dVar13 - dVar21));
  dVar21 = dVar11 + dVar15;
  local_8570 = (dVar14 - (dVar18 - dVar12)) + (dVar12 - (dVar18 - (dVar18 - dVar12)));
  dStack_8568 = (dVar15 - (dVar21 - (dVar21 - dVar15))) + (dVar11 - (dVar21 - dVar15));
  dVar15 = dVar17 + dVar19;
  dVar14 = dVar16 + dVar21;
  dVar11 = dVar13 + dVar14;
  dVar13 = (dVar13 - (dVar11 - (dVar11 - dVar13))) + (dVar14 - (dVar11 - dVar13));
  dVar12 = (dVar17 - (dVar15 - (dVar15 - dVar17))) + (dVar19 - (dVar15 - dVar17));
  dVar17 = (dVar16 - (dVar14 - (dVar14 - dVar16))) + (dVar21 - (dVar14 - dVar16));
  dVar18 = dVar17 + dVar12;
  dVar14 = dVar13 + dVar18;
  dVar13 = (dVar13 - (dVar14 - (dVar14 - dVar13))) + (dVar18 - (dVar14 - dVar13));
  dVar16 = dVar11 + dVar14;
  dVar11 = (dVar11 - (dVar16 - (dVar16 - dVar11))) + (dVar14 - (dVar16 - dVar11));
  dVar14 = dVar13 + dVar15;
  local_8560 = (dVar17 - (dVar18 - (dVar18 - dVar17))) + (dVar12 - (dVar18 - dVar17));
  dStack_8558 = (dVar13 - (dVar14 - (dVar14 - dVar13))) + (dVar15 - (dVar14 - dVar13));
  dVar12 = dVar11 + dVar14;
  local_8540 = dVar16 + dVar12;
  local_8550 = (dVar11 - (dVar12 - (dVar12 - dVar11))) + (dVar14 - (dVar12 - dVar11));
  dStack_8548 = (dVar16 - (local_8540 - (local_8540 - dVar16))) + (dVar12 - (local_8540 - dVar16));
  dVar22 = splitter * b_09 - (splitter * b_09 - b_09);
  dVar28 = b_10 * splitter - (b_10 * splitter - b_10);
  dVar18 = -b_04;
  dVar19 = -b_00;
  dVar12 = splitter * dVar18 - (b_04 + splitter * dVar18);
  dVar17 = splitter * dVar19 - (b_00 + splitter * dVar19);
  dVar11 = b_09 * dVar18;
  dVar13 = b_09 * dVar19;
  dVar27 = b_09 - dVar22;
  dVar14 = dVar18 - dVar12;
  dVar23 = dVar19 - dVar17;
  local_85f8 = dVar27 * dVar14 - (((dVar11 - dVar22 * dVar12) - dVar27 * dVar12) - dVar22 * dVar14);
  dVar21 = b_10 - dVar28;
  dVar18 = dVar18 * b_10;
  dVar19 = dVar19 * b_10;
  dVar24 = dVar21 * dVar14 - (((dVar18 - dVar28 * dVar12) - dVar21 * dVar12) - dVar28 * dVar14);
  dVar26 = dVar21 * dVar23 - (((dVar19 - dVar28 * dVar17) - dVar21 * dVar17) - dVar28 * dVar23);
  dVar15 = dVar11 + dVar24;
  dVar16 = dVar13 + dVar26;
  dVar14 = dVar18 + dVar15;
  dVar12 = dVar15 - (dVar14 - dVar18);
  dVar18 = dVar23 * dVar27 - (((dVar13 - dVar22 * dVar17) - dVar17 * dVar27) - dVar22 * dVar23);
  dVar17 = (dVar11 - (dVar15 - (dVar15 - dVar11))) + (dVar24 - (dVar15 - dVar11));
  dVar11 = (dVar13 - (dVar16 - (dVar16 - dVar13))) + (dVar26 - (dVar16 - dVar13));
  dVar15 = dVar18 + dVar17;
  dVar13 = dVar12 + dVar15;
  dVar23 = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar15 - (dVar13 - dVar12));
  dVar12 = dVar14 + dVar13;
  dVar13 = (dVar14 - (dVar12 - (dVar12 - dVar14))) + (dVar13 - (dVar12 - dVar14));
  dVar14 = dVar11 + dVar23;
  local_85f0 = (dVar18 - (dVar15 - dVar17)) + (dVar17 - (dVar15 - (dVar15 - dVar17)));
  dStack_85e8 = (dVar23 - (dVar14 - (dVar14 - dVar23))) + (dVar11 - (dVar14 - dVar23));
  dVar18 = dVar19 + dVar16;
  dVar11 = dVar13 + dVar14;
  dVar17 = dVar12 + dVar11;
  dVar12 = (dVar12 - (dVar17 - (dVar17 - dVar12))) + (dVar11 - (dVar17 - dVar12));
  dVar15 = (dVar19 - (dVar18 - (dVar18 - dVar19))) + (dVar16 - (dVar18 - dVar19));
  dVar16 = (dVar13 - (dVar11 - (dVar11 - dVar13))) + (dVar14 - (dVar11 - dVar13));
  dVar14 = dVar16 + dVar15;
  dVar11 = dVar12 + dVar14;
  dVar12 = (dVar12 - (dVar11 - (dVar11 - dVar12))) + (dVar14 - (dVar11 - dVar12));
  dVar13 = dVar17 + dVar11;
  dVar11 = (dVar17 - (dVar13 - (dVar13 - dVar17))) + (dVar11 - (dVar13 - dVar17));
  dVar17 = dVar12 + dVar18;
  local_85e0 = (dVar16 - (dVar14 - (dVar14 - dVar16))) + (dVar15 - (dVar14 - dVar16));
  dStack_85d8 = (dVar12 - (dVar17 - (dVar17 - dVar12))) + (dVar18 - (dVar17 - dVar12));
  dVar12 = dVar11 + dVar17;
  local_85c0 = dVar13 + dVar12;
  local_85d0 = (dVar11 - (dVar12 - (dVar12 - dVar11))) + (dVar17 - (dVar12 - dVar11));
  dStack_85c8 = (dVar13 - (local_85c0 - (local_85c0 - dVar13))) + (dVar12 - (local_85c0 - dVar13));
  dVar12 = splitter * b_07 - (splitter * b_07 - b_07);
  dVar17 = splitter * b - (splitter * b - b);
  dVar15 = b_09 * b_07;
  dVar18 = b_09 * b;
  dVar11 = b_07 - dVar12;
  dVar23 = b - dVar17;
  local_7e78 = dVar27 * dVar11 - (((dVar15 - dVar22 * dVar12) - dVar27 * dVar12) - dVar22 * dVar11);
  dVar14 = b_10 * b_07;
  dVar24 = b_10 * b;
  dVar16 = dVar21 * dVar11 - (((dVar14 - dVar28 * dVar12) - dVar21 * dVar12) - dVar28 * dVar11);
  dVar19 = dVar21 * dVar23 - (((dVar24 - dVar28 * dVar17) - dVar21 * dVar17) - dVar28 * dVar23);
  dVar12 = dVar15 + dVar16;
  dVar11 = dVar18 + dVar19;
  dVar13 = dVar14 + dVar12;
  dVar14 = dVar12 - (dVar13 - dVar14);
  dVar21 = dVar23 * dVar27 - (((dVar18 - dVar22 * dVar17) - dVar17 * dVar27) - dVar22 * dVar23);
  dVar16 = (dVar15 - (dVar12 - (dVar12 - dVar15))) + (dVar16 - (dVar12 - dVar15));
  dVar18 = (dVar18 - (dVar11 - (dVar11 - dVar18))) + (dVar19 - (dVar11 - dVar18));
  dVar15 = dVar21 + dVar16;
  dVar17 = dVar14 + dVar15;
  dVar14 = (dVar14 - (dVar17 - (dVar17 - dVar14))) + (dVar15 - (dVar17 - dVar14));
  dVar12 = dVar13 + dVar17;
  dVar17 = (dVar13 - (dVar12 - (dVar12 - dVar13))) + (dVar17 - (dVar12 - dVar13));
  dVar19 = dVar18 + dVar14;
  local_7e70 = (dVar21 - (dVar15 - dVar16)) + (dVar16 - (dVar15 - (dVar15 - dVar16)));
  dStack_7e68 = (dVar14 - (dVar19 - (dVar19 - dVar14))) + (dVar18 - (dVar19 - dVar14));
  dVar14 = dVar24 + dVar11;
  dVar15 = dVar17 + dVar19;
  dVar13 = dVar12 + dVar15;
  dVar12 = (dVar12 - (dVar13 - (dVar13 - dVar12))) + (dVar15 - (dVar13 - dVar12));
  dVar16 = (dVar24 - (dVar14 - (dVar14 - dVar24))) + (dVar11 - (dVar14 - dVar24));
  dVar18 = (dVar17 - (dVar15 - (dVar15 - dVar17))) + (dVar19 - (dVar15 - dVar17));
  dVar15 = dVar18 + dVar16;
  dVar17 = dVar12 + dVar15;
  dVar12 = (dVar12 - (dVar17 - (dVar17 - dVar12))) + (dVar15 - (dVar17 - dVar12));
  dVar11 = dVar13 + dVar17;
  dVar13 = (dVar13 - (dVar11 - (dVar11 - dVar13))) + (dVar17 - (dVar11 - dVar13));
  dVar17 = dVar12 + dVar14;
  local_7e60 = (dVar18 - (dVar15 - (dVar15 - dVar18))) + (dVar16 - (dVar15 - dVar18));
  dStack_7e58 = (dVar12 - (dVar17 - (dVar17 - dVar12))) + (dVar14 - (dVar17 - dVar12));
  dVar12 = dVar13 + dVar17;
  local_7e40 = dVar11 + dVar12;
  local_7e50 = (dVar13 - (dVar12 - (dVar12 - dVar13))) + (dVar17 - (dVar12 - dVar13));
  dStack_7e48 = (dVar11 - (local_7e40 - (local_7e40 - dVar11))) + (dVar12 - (local_7e40 - dVar11));
  dVar26 = splitter * b_05 - (splitter * b_05 - b_05);
  dVar28 = splitter * b_01 - (splitter * b_01 - b_01);
  dVar18 = -b_03;
  dVar24 = -b_08;
  dVar15 = splitter * dVar18 - (splitter * dVar18 + b_03);
  dVar16 = splitter * dVar24 - (b_08 + splitter * dVar24);
  dVar13 = b_05 * dVar18;
  dVar14 = b_05 * dVar24;
  dVar27 = b_05 - dVar26;
  dVar17 = b_01 * dVar18;
  dVar11 = b_01 * dVar24;
  dVar18 = dVar18 - dVar15;
  dVar24 = dVar24 - dVar16;
  local_7eb8 = dVar27 * dVar18 - (((dVar13 - dVar26 * dVar15) - dVar27 * dVar15) - dVar26 * dVar18);
  dVar12 = b_01 - dVar28;
  dVar22 = dVar12 * dVar18 - (((dVar17 - dVar28 * dVar15) - dVar12 * dVar15) - dVar28 * dVar18);
  dVar23 = dVar12 * dVar24 - (((dVar11 - dVar28 * dVar16) - dVar12 * dVar16) - dVar28 * dVar24);
  dVar15 = dVar13 + dVar22;
  dVar18 = dVar14 + dVar23;
  dVar19 = dVar17 + dVar15;
  dVar21 = dVar15 - (dVar19 - dVar17);
  dVar24 = dVar24 * dVar27 - (((dVar14 - dVar26 * dVar16) - dVar16 * dVar27) - dVar26 * dVar24);
  dVar17 = (dVar13 - (dVar15 - (dVar15 - dVar13))) + (dVar22 - (dVar15 - dVar13));
  dVar13 = (dVar14 - (dVar18 - (dVar18 - dVar14))) + (dVar23 - (dVar18 - dVar14));
  dVar16 = dVar24 + dVar17;
  dVar15 = dVar21 + dVar16;
  dVar21 = (dVar21 - (dVar15 - (dVar15 - dVar21))) + (dVar16 - (dVar15 - dVar21));
  dVar14 = dVar19 + dVar15;
  dVar15 = (dVar19 - (dVar14 - (dVar14 - dVar19))) + (dVar15 - (dVar14 - dVar19));
  dVar22 = dVar13 + dVar21;
  local_7eb0 = (dVar24 - (dVar16 - dVar17)) + (dVar17 - (dVar16 - (dVar16 - dVar17)));
  dStack_7ea8 = (dVar21 - (dVar22 - (dVar22 - dVar21))) + (dVar13 - (dVar22 - dVar21));
  dVar19 = dVar11 + dVar18;
  dVar16 = dVar15 + dVar22;
  dVar13 = dVar14 + dVar16;
  dVar14 = (dVar14 - (dVar13 - (dVar13 - dVar14))) + (dVar16 - (dVar13 - dVar14));
  dVar17 = (dVar11 - (dVar19 - (dVar19 - dVar11))) + (dVar18 - (dVar19 - dVar11));
  dVar11 = (dVar15 - (dVar16 - (dVar16 - dVar15))) + (dVar22 - (dVar16 - dVar15));
  dVar18 = dVar11 + dVar17;
  dVar15 = dVar14 + dVar18;
  dVar14 = (dVar14 - (dVar15 - (dVar15 - dVar14))) + (dVar18 - (dVar15 - dVar14));
  dVar16 = dVar13 + dVar15;
  dVar13 = (dVar13 - (dVar16 - (dVar16 - dVar13))) + (dVar15 - (dVar16 - dVar13));
  dVar15 = dVar14 + dVar19;
  local_7ea0 = (dVar11 - (dVar18 - (dVar18 - dVar11))) + (dVar17 - (dVar18 - dVar11));
  dStack_7e98 = (dVar14 - (dVar15 - (dVar15 - dVar14))) + (dVar19 - (dVar15 - dVar14));
  dVar17 = dVar13 + dVar15;
  local_7e80 = dVar16 + dVar17;
  local_7e90 = (dVar13 - (dVar17 - (dVar17 - dVar13))) + (dVar15 - (dVar17 - dVar13));
  dStack_7e88 = (dVar16 - (local_7e80 - (local_7e80 - dVar16))) + (dVar17 - (local_7e80 - dVar16));
  dVar17 = splitter * b_04 - (splitter * b_04 - b_04);
  dVar18 = splitter * b_00 - (splitter * b_00 - b_00);
  dVar11 = b_05 * b_04;
  dVar13 = b_00 * b_05;
  dVar19 = b_01 * b_04;
  dVar22 = b_01 * b_00;
  dVar14 = b_04 - dVar17;
  dVar21 = b_00 - dVar18;
  local_8638 = dVar27 * dVar14 - (((dVar11 - dVar26 * dVar17) - dVar27 * dVar17) - dVar26 * dVar14);
  dVar17 = dVar12 * dVar14 - (((dVar19 - dVar28 * dVar17) - dVar12 * dVar17) - dVar28 * dVar14);
  dVar12 = dVar12 * dVar21 - (((dVar22 - dVar28 * dVar18) - dVar12 * dVar18) - dVar28 * dVar21);
  dVar14 = dVar11 + dVar17;
  dVar15 = dVar13 + dVar12;
  dVar16 = dVar19 + dVar14;
  dVar19 = dVar14 - (dVar16 - dVar19);
  dVar21 = dVar21 * dVar27 - (((dVar13 - dVar26 * dVar18) - dVar18 * dVar27) - dVar26 * dVar21);
  dVar17 = (dVar11 - (dVar14 - (dVar14 - dVar11))) + (dVar17 - (dVar14 - dVar11));
  dVar11 = (dVar13 - (dVar15 - (dVar15 - dVar13))) + (dVar12 - (dVar15 - dVar13));
  dVar14 = dVar21 + dVar17;
  dVar13 = dVar19 + dVar14;
  dVar18 = (dVar19 - (dVar13 - (dVar13 - dVar19))) + (dVar14 - (dVar13 - dVar19));
  dVar12 = dVar16 + dVar13;
  dVar13 = (dVar16 - (dVar12 - (dVar12 - dVar16))) + (dVar13 - (dVar12 - dVar16));
  dVar16 = dVar11 + dVar18;
  local_8630 = (dVar21 - (dVar14 - dVar17)) + (dVar17 - (dVar14 - (dVar14 - dVar17)));
  dStack_8628 = (dVar18 - (dVar16 - (dVar16 - dVar18))) + (dVar11 - (dVar16 - dVar18));
  dVar14 = dVar22 + dVar15;
  dVar11 = dVar13 + dVar16;
  dVar17 = dVar12 + dVar11;
  dVar12 = (dVar12 - (dVar17 - (dVar17 - dVar12))) + (dVar11 - (dVar17 - dVar12));
  dVar18 = (dVar22 - (dVar14 - (dVar14 - dVar22))) + (dVar15 - (dVar14 - dVar22));
  dVar16 = (dVar13 - (dVar11 - (dVar11 - dVar13))) + (dVar16 - (dVar11 - dVar13));
  dVar15 = dVar16 + dVar18;
  dVar11 = dVar12 + dVar15;
  dVar12 = (dVar12 - (dVar11 - (dVar11 - dVar12))) + (dVar15 - (dVar11 - dVar12));
  dVar13 = dVar17 + dVar11;
  dVar11 = (dVar17 - (dVar13 - (dVar13 - dVar17))) + (dVar11 - (dVar13 - dVar17));
  dVar17 = dVar12 + dVar14;
  local_8620 = (dVar16 - (dVar15 - (dVar15 - dVar16))) + (dVar18 - (dVar15 - dVar16));
  dStack_8618 = (dVar12 - (dVar17 - (dVar17 - dVar12))) + (dVar14 - (dVar17 - dVar12));
  dVar12 = dVar11 + dVar17;
  local_8600 = dVar13 + dVar12;
  local_8610 = (dVar11 - (dVar12 - (dVar12 - dVar11))) + (dVar17 - (dVar12 - dVar11));
  dStack_8608 = (dVar13 - (local_8600 - (local_8600 - dVar13))) + (dVar12 - (local_8600 - dVar13));
  dVar17 = -b_07;
  dVar21 = -b;
  dVar12 = splitter * dVar17 - (splitter * dVar17 + b_07);
  dVar13 = splitter * dVar21 - (b + splitter * dVar21);
  dVar18 = b_06 * dVar17;
  dVar19 = b_06 * dVar21;
  dStack_8650 = auVar1._8_8_;
  dVar14 = b_02 * dVar17;
  dStack_8650 = dStack_8650 * dVar21;
  dVar17 = dVar17 - dVar12;
  dVar21 = dVar21 - dVar13;
  local_85b8 = dVar20 * dVar17 - (((dVar18 - dVar9 * dVar12) - dVar20 * dVar12) - dVar9 * dVar17);
  dVar15 = dVar25 * dVar17 - (((dVar14 - dVar10 * dVar12) - dVar25 * dVar12) - dVar10 * dVar17);
  dVar16 = dVar25 * dVar21 - (((dStack_8650 - dVar10 * dVar13) - dVar25 * dVar13) - dVar10 * dVar21)
  ;
  dVar17 = dVar18 + dVar15;
  dVar10 = dVar19 + dVar16;
  dVar11 = dVar14 + dVar17;
  dVar12 = dVar17 - (dVar11 - dVar14);
  dVar14 = dVar21 * dVar20 - (((dVar19 - dVar9 * dVar13) - dVar13 * dVar20) - dVar9 * dVar21);
  dVar18 = (dVar18 - (dVar17 - (dVar17 - dVar18))) + (dVar15 - (dVar17 - dVar18));
  dVar16 = (dVar19 - (dVar10 - (dVar10 - dVar19))) + (dVar16 - (dVar10 - dVar19));
  dVar9 = dVar14 + dVar18;
  dVar17 = dVar12 + dVar9;
  dVar13 = (dVar12 - (dVar17 - (dVar17 - dVar12))) + (dVar9 - (dVar17 - dVar12));
  dVar12 = dVar11 + dVar17;
  dVar17 = (dVar11 - (dVar12 - (dVar12 - dVar11))) + (dVar17 - (dVar12 - dVar11));
  dVar15 = dVar16 + dVar13;
  local_85b0 = (dVar14 - (dVar9 - dVar18)) + (dVar18 - (dVar9 - (dVar9 - dVar18)));
  dStack_85a8 = (dVar13 - (dVar15 - (dVar15 - dVar13))) + (dVar16 - (dVar15 - dVar13));
  dVar13 = dStack_8650 + dVar10;
  dVar9 = dVar17 + dVar15;
  dVar11 = dVar12 + dVar9;
  dVar12 = (dVar12 - (dVar11 - (dVar11 - dVar12))) + (dVar9 - (dVar11 - dVar12));
  dVar16 = (dStack_8650 - (dVar13 - (dVar13 - dStack_8650))) + (dVar10 - (dVar13 - dStack_8650));
  dVar15 = (dVar17 - (dVar9 - (dVar9 - dVar17))) + (dVar15 - (dVar9 - dVar17));
  dVar14 = dVar15 + dVar16;
  dVar17 = dVar12 + dVar14;
  dVar12 = (dVar12 - (dVar17 - (dVar17 - dVar12))) + (dVar14 - (dVar17 - dVar12));
  dVar9 = dVar11 + dVar17;
  dVar10 = (dVar11 - (dVar9 - (dVar9 - dVar11))) + (dVar17 - (dVar9 - dVar11));
  dVar17 = dVar12 + dVar13;
  local_85a0 = (dVar15 - (dVar14 - (dVar14 - dVar15))) + (dVar16 - (dVar14 - dVar15));
  dStack_8598 = (dVar12 - (dVar17 - (dVar17 - dVar12))) + (dVar13 - (dVar17 - dVar12));
  dVar12 = dVar10 + dVar17;
  local_8580 = dVar9 + dVar12;
  local_8590 = (dVar10 - (dVar12 - (dVar12 - dVar10))) + (dVar17 - (dVar12 - dVar10));
  dStack_8588 = (dVar9 - (local_8580 - (local_8580 - dVar9))) + (dVar12 - (local_8580 - dVar9));
  iVar2 = fast_expansion_sum_zeroelim(8,&local_7e78,8,&local_7eb8,local_8538);
  iVar3 = scale_expansion_zeroelim(iVar2,local_8538,b_02,local_7938);
  iVar3 = scale_expansion_zeroelim(iVar3,local_7938,b_02,local_7b38);
  iVar4 = scale_expansion_zeroelim(iVar2,local_8538,b_06,local_7fb8);
  uVar5 = scale_expansion_zeroelim(iVar4,local_7fb8,b_02,local_81b8);
  if (0 < (int)uVar5) {
    uVar8 = 0;
    do {
      local_81b8[uVar8] = local_81b8[uVar8] + local_81b8[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  iVar4 = scale_expansion_zeroelim(iVar4,local_7fb8,b_06,local_7638);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,local_7b38,uVar5,local_81b8,local_6a38);
  iVar3 = fast_expansion_sum_zeroelim(iVar3,local_6a38,iVar4,local_7638,local_7438);
  iVar4 = scale_expansion_zeroelim(iVar2,local_8538,b_00,local_7c38);
  iVar4 = scale_expansion_zeroelim(iVar4,local_7c38,b_00,local_7e38);
  iVar2 = scale_expansion_zeroelim(iVar2,local_8538,b_04,local_82b8);
  uVar5 = scale_expansion_zeroelim(iVar2,local_82b8,b_00,local_84b8);
  if (0 < (int)uVar5) {
    uVar8 = 0;
    do {
      local_84b8[uVar8] = local_84b8[uVar8] + local_84b8[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  iVar2 = scale_expansion_zeroelim(iVar2,local_82b8,b_04,local_7838);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,local_7e38,uVar5,local_84b8,local_6e38);
  iVar2 = fast_expansion_sum_zeroelim(iVar4,local_6e38,iVar2,local_7838,local_6638);
  iVar2 = fast_expansion_sum_zeroelim(iVar3,local_7438,iVar2,local_6638,local_5438);
  iVar3 = fast_expansion_sum_zeroelim(8,&local_8638,8,&local_85b8,local_8538);
  iVar4 = scale_expansion_zeroelim(iVar3,local_8538,b_10,local_7938);
  iVar4 = scale_expansion_zeroelim(iVar4,local_7938,b_10,local_7b38);
  iVar6 = scale_expansion_zeroelim(iVar3,local_8538,b_09,local_7fb8);
  uVar5 = scale_expansion_zeroelim(iVar6,local_7fb8,b_10,local_81b8);
  if (0 < (int)uVar5) {
    uVar8 = 0;
    do {
      local_81b8[uVar8] = local_81b8[uVar8] + local_81b8[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  iVar6 = scale_expansion_zeroelim(iVar6,local_7fb8,b_09,local_7638);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,local_7b38,uVar5,local_81b8,local_6a38);
  iVar4 = fast_expansion_sum_zeroelim(iVar4,local_6a38,iVar6,local_7638,local_7438);
  iVar6 = scale_expansion_zeroelim(iVar3,local_8538,b_08,local_7c38);
  iVar6 = scale_expansion_zeroelim(iVar6,local_7c38,b_08,local_7e38);
  iVar3 = scale_expansion_zeroelim(iVar3,local_8538,b_03,local_82b8);
  uVar5 = scale_expansion_zeroelim(iVar3,local_82b8,b_08,local_84b8);
  if (0 < (int)uVar5) {
    uVar8 = 0;
    do {
      local_84b8[uVar8] = local_84b8[uVar8] + local_84b8[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  iVar3 = scale_expansion_zeroelim(iVar3,local_82b8,b_03,local_7838);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,local_7e38,uVar5,local_84b8,local_6e38);
  iVar3 = fast_expansion_sum_zeroelim(iVar6,local_6e38,iVar3,local_7838,local_6638);
  iVar3 = fast_expansion_sum_zeroelim(iVar4,local_7438,iVar3,local_6638,local_6038);
  iVar4 = fast_expansion_sum_zeroelim(8,&local_8578,8,&local_85f8,local_8538);
  iVar6 = scale_expansion_zeroelim(iVar4,local_8538,b_01,local_7938);
  iVar6 = scale_expansion_zeroelim(iVar6,local_7938,b_01,local_7b38);
  iVar7 = scale_expansion_zeroelim(iVar4,local_8538,b_05,local_7fb8);
  uVar5 = scale_expansion_zeroelim(iVar7,local_7fb8,b_01,local_81b8);
  if (0 < (int)uVar5) {
    uVar8 = 0;
    do {
      local_81b8[uVar8] = local_81b8[uVar8] + local_81b8[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  iVar7 = scale_expansion_zeroelim(iVar7,local_7fb8,b_05,local_7638);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,local_7b38,uVar5,local_81b8,local_6a38);
  iVar6 = fast_expansion_sum_zeroelim(iVar6,local_6a38,iVar7,local_7638,local_7438);
  iVar7 = scale_expansion_zeroelim(iVar4,local_8538,b,local_7c38);
  iVar7 = scale_expansion_zeroelim(iVar7,local_7c38,b,local_7e38);
  iVar4 = scale_expansion_zeroelim(iVar4,local_8538,b_07,local_82b8);
  uVar5 = scale_expansion_zeroelim(iVar4,local_82b8,b,local_84b8);
  if (0 < (int)uVar5) {
    uVar8 = 0;
    do {
      local_84b8[uVar8] = local_84b8[uVar8] + local_84b8[uVar8];
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  iVar4 = scale_expansion_zeroelim(iVar4,local_82b8,b_07,local_7838);
  iVar7 = fast_expansion_sum_zeroelim(iVar7,local_7e38,uVar5,local_84b8,local_6e38);
  iVar4 = fast_expansion_sum_zeroelim(iVar7,local_6e38,iVar4,local_7838,local_6638);
  iVar4 = fast_expansion_sum_zeroelim(iVar6,local_7438,iVar4,local_6638,local_4838);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,local_5438,iVar3,local_6038,local_1838);
  iVar2 = fast_expansion_sum_zeroelim(iVar2,local_1838,iVar4,local_4838,adStack_3c40 + 1);
  return adStack_3c40[iVar2];
}

Assistant:

REAL incircleslow(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  INEXACT REAL adx, bdx, cdx, ady, bdy, cdy;
  REAL adxtail, bdxtail, cdxtail;
  REAL adytail, bdytail, cdytail;
  REAL negate, negatetail;
  INEXACT REAL axby7, bxcy7, axcy7, bxay7, cxby7, cxay7;
  REAL axby[8], bxcy[8], axcy[8], bxay[8], cxby[8], cxay[8];
  REAL temp16[16];
  int temp16len;
  REAL detx[32], detxx[64], detxt[32], detxxt[64], detxtxt[64];
  int xlen, xxlen, xtlen, xxtlen, xtxtlen;
  REAL x1[128], x2[192];
  int x1len, x2len;
  REAL dety[32], detyy[64], detyt[32], detyyt[64], detytyt[64];
  int ylen, yylen, ytlen, yytlen, ytytlen;
  REAL y1[128], y2[192];
  int y1len, y2len;
  REAL adet[384], bdet[384], cdet[384], abdet[768], deter[1152];
  int alen, blen, clen, ablen, deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL a0hi, a0lo, a1hi, a1lo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j, _k, _l, _m, _n;
  REAL _0, _1, _2;

  Two_Diff(pa[0], pd[0], adx, adxtail);
  Two_Diff(pa[1], pd[1], ady, adytail);
  Two_Diff(pb[0], pd[0], bdx, bdxtail);
  Two_Diff(pb[1], pd[1], bdy, bdytail);
  Two_Diff(pc[0], pd[0], cdx, cdxtail);
  Two_Diff(pc[1], pd[1], cdy, cdytail);

  Two_Two_Product(adx, adxtail, bdy, bdytail,
                  axby7, axby[6], axby[5], axby[4],
                  axby[3], axby[2], axby[1], axby[0]);
  axby[7] = axby7;
  negate = -ady;
  negatetail = -adytail;
  Two_Two_Product(bdx, bdxtail, negate, negatetail,
                  bxay7, bxay[6], bxay[5], bxay[4],
                  bxay[3], bxay[2], bxay[1], bxay[0]);
  bxay[7] = bxay7;
  Two_Two_Product(bdx, bdxtail, cdy, cdytail,
                  bxcy7, bxcy[6], bxcy[5], bxcy[4],
                  bxcy[3], bxcy[2], bxcy[1], bxcy[0]);
  bxcy[7] = bxcy7;
  negate = -bdy;
  negatetail = -bdytail;
  Two_Two_Product(cdx, cdxtail, negate, negatetail,
                  cxby7, cxby[6], cxby[5], cxby[4],
                  cxby[3], cxby[2], cxby[1], cxby[0]);
  cxby[7] = cxby7;
  Two_Two_Product(cdx, cdxtail, ady, adytail,
                  cxay7, cxay[6], cxay[5], cxay[4],
                  cxay[3], cxay[2], cxay[1], cxay[0]);
  cxay[7] = cxay7;
  negate = -cdy;
  negatetail = -cdytail;
  Two_Two_Product(adx, adxtail, negate, negatetail,
                  axcy7, axcy[6], axcy[5], axcy[4],
                  axcy[3], axcy[2], axcy[1], axcy[0]);
  axcy[7] = axcy7;


  temp16len = fast_expansion_sum_zeroelim(8, bxcy, 8, cxby, temp16);

  xlen = scale_expansion_zeroelim(temp16len, temp16, adx, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, adx, detxx);
  xtlen = scale_expansion_zeroelim(temp16len, temp16, adxtail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, adx, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, adxtail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);

  ylen = scale_expansion_zeroelim(temp16len, temp16, ady, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, ady, detyy);
  ytlen = scale_expansion_zeroelim(temp16len, temp16, adytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, ady, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, adytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);

  alen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, adet);


  temp16len = fast_expansion_sum_zeroelim(8, cxay, 8, axcy, temp16);

  xlen = scale_expansion_zeroelim(temp16len, temp16, bdx, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, bdx, detxx);
  xtlen = scale_expansion_zeroelim(temp16len, temp16, bdxtail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, bdx, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, bdxtail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);

  ylen = scale_expansion_zeroelim(temp16len, temp16, bdy, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, bdy, detyy);
  ytlen = scale_expansion_zeroelim(temp16len, temp16, bdytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, bdy, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, bdytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);

  blen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, bdet);


  temp16len = fast_expansion_sum_zeroelim(8, axby, 8, bxay, temp16);

  xlen = scale_expansion_zeroelim(temp16len, temp16, cdx, detx);
  xxlen = scale_expansion_zeroelim(xlen, detx, cdx, detxx);
  xtlen = scale_expansion_zeroelim(temp16len, temp16, cdxtail, detxt);
  xxtlen = scale_expansion_zeroelim(xtlen, detxt, cdx, detxxt);
  for (i = 0; i < xxtlen; i++) {
    detxxt[i] *= 2.0;
  }
  xtxtlen = scale_expansion_zeroelim(xtlen, detxt, cdxtail, detxtxt);
  x1len = fast_expansion_sum_zeroelim(xxlen, detxx, xxtlen, detxxt, x1);
  x2len = fast_expansion_sum_zeroelim(x1len, x1, xtxtlen, detxtxt, x2);

  ylen = scale_expansion_zeroelim(temp16len, temp16, cdy, dety);
  yylen = scale_expansion_zeroelim(ylen, dety, cdy, detyy);
  ytlen = scale_expansion_zeroelim(temp16len, temp16, cdytail, detyt);
  yytlen = scale_expansion_zeroelim(ytlen, detyt, cdy, detyyt);
  for (i = 0; i < yytlen; i++) {
    detyyt[i] *= 2.0;
  }
  ytytlen = scale_expansion_zeroelim(ytlen, detyt, cdytail, detytyt);
  y1len = fast_expansion_sum_zeroelim(yylen, detyy, yytlen, detyyt, y1);
  y2len = fast_expansion_sum_zeroelim(y1len, y1, ytytlen, detytyt, y2);

  clen = fast_expansion_sum_zeroelim(x2len, x2, y2len, y2, cdet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, clen, cdet, deter);

  return deter[deterlen - 1];
}